

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O1

Fl_Double_Window * make_shell_window(void)

{
  Fl_Double_Window *pFVar1;
  Fl_Input *this;
  Fl_Check_Button *pFVar2;
  Fl_Return_Button *pFVar3;
  Fl_Button *this_00;
  Fl_Text_Display *this_01;
  Fl_Group *pFVar4;
  Fl_Text_Buffer *this_02;
  char buf [1024];
  int local_418 [258];
  
  pFVar1 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar1,0x16d,0x7d,"Shell Command");
  shell_window = pFVar1;
  this = (Fl_Input *)operator_new(200);
  Fl_Input::Fl_Input(this,10,0x1b,0x15b,0x19,"Command:");
  shell_command_input = this;
  (this->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (this->super_Fl_Input_).super_Fl_Widget.callback_ = cb_shell_command_input;
  (this->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  Fl_Preferences::get(&fluid_prefs,"shell_command",(char *)local_418,"",0x400);
  Fl_Input_::value(&shell_command_input->super_Fl_Input_,(char *)local_418);
  pFVar2 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar2,0x80,0x3d,0x5d,0x13,"Write Code");
  shell_writecode_button = pFVar2;
  (pFVar2->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar2->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       cb_shell_writecode_button;
  Fl_Preferences::get(&fluid_prefs,"shell_writecode",local_418,1);
  Fl_Button::value((Fl_Button *)shell_writecode_button,local_418[0]);
  pFVar2 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar2,0xe7,0x3d,0x7e,0x13,"Write Messages");
  shell_writemsgs_button = pFVar2;
  (pFVar2->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar2->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ =
       cb_shell_writemsgs_button;
  Fl_Preferences::get(&fluid_prefs,"shell_writemsgs",local_418,0);
  Fl_Button::value((Fl_Button *)shell_writemsgs_button,local_418[0]);
  pFVar2 = (Fl_Check_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button(pFVar2,10,0x3e,0x6c,0x13,"Save .FL File");
  shell_savefl_button = pFVar2;
  (pFVar2->super_Fl_Light_Button).super_Fl_Button.down_box_ = '\x03';
  (pFVar2->super_Fl_Light_Button).super_Fl_Button.super_Fl_Widget.callback_ = cb_shell_savefl_button
  ;
  Fl_Preferences::get(&fluid_prefs,"shell_savefl",local_418,1);
  Fl_Button::value((Fl_Button *)shell_savefl_button,local_418[0]);
  pFVar3 = (Fl_Return_Button *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button(pFVar3,0x84,0x5a,0x8f,0x19,"Run Command");
  (pFVar3->super_Fl_Button).super_Fl_Widget.callback_ = do_shell_command;
  this_00 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_00,0x11d,0x5a,0x48,0x19,"Cancel");
  (this_00->super_Fl_Widget).callback_ = cb_Cancel;
  Fl_Group::end((Fl_Group *)shell_window);
  pFVar1 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar1,0x22b,0x1ae,"Shell Command Output");
  shell_run_window = pFVar1;
  this_01 = (Fl_Text_Display *)operator_new(0x1a8);
  Fl_Text_Display::Fl_Text_Display(this_01,10,10,0x217,0x177,(char *)0x0);
  shell_run_display = this_01;
  (this_01->super_Fl_Group).super_Fl_Widget.box_ = '\x03';
  this_01->textfont_ = 4;
  this_01->mColumnScale = 0.0;
  pFVar4 = Fl_Group::current();
  pFVar4->resizable_ = (Fl_Widget *)shell_run_display;
  this_02 = (Fl_Text_Buffer *)operator_new(0x88);
  Fl_Text_Buffer::Fl_Text_Buffer(this_02,0,0x400);
  shell_run_buffer = this_02;
  Fl_Text_Display::buffer(shell_run_display,this_02);
  pFVar3 = (Fl_Return_Button *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button(pFVar3,0x1d4,0x18b,0x4d,0x19,"Close");
  shell_run_button = pFVar3;
  (pFVar3->super_Fl_Button).super_Fl_Widget.callback_ = cb_shell_run_button;
  Fl_Group::end((Fl_Group *)shell_run_window);
  return shell_run_window;
}

Assistant:

Fl_Double_Window* make_shell_window() {
  { shell_window = new Fl_Double_Window(365, 125, "Shell Command");
    { shell_command_input = new Fl_Input(10, 27, 347, 25, "Command:");
      shell_command_input->labelfont(1);
      shell_command_input->callback((Fl_Callback*)cb_shell_command_input);
      shell_command_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      char buf[1024];
      fluid_prefs.get("shell_command", buf, "", sizeof(buf));
      shell_command_input->value(buf);
    } // Fl_Input* shell_command_input
    { shell_writecode_button = new Fl_Check_Button(128, 61, 93, 19, "Write Code");
      shell_writecode_button->down_box(FL_DOWN_BOX);
      shell_writecode_button->callback((Fl_Callback*)cb_shell_writecode_button);
      int b;
      fluid_prefs.get("shell_writecode", b, 1);
      shell_writecode_button->value(b);
    } // Fl_Check_Button* shell_writecode_button
    { shell_writemsgs_button = new Fl_Check_Button(231, 61, 126, 19, "Write Messages");
      shell_writemsgs_button->down_box(FL_DOWN_BOX);
      shell_writemsgs_button->callback((Fl_Callback*)cb_shell_writemsgs_button);
      int b;
      fluid_prefs.get("shell_writemsgs", b, 0);
      shell_writemsgs_button->value(b);
    } // Fl_Check_Button* shell_writemsgs_button
    { shell_savefl_button = new Fl_Check_Button(10, 62, 108, 19, "Save .FL File");
      shell_savefl_button->down_box(FL_DOWN_BOX);
      shell_savefl_button->callback((Fl_Callback*)cb_shell_savefl_button);
      int b;
      fluid_prefs.get("shell_savefl", b, 1);
      shell_savefl_button->value(b);
    } // Fl_Check_Button* shell_savefl_button
    { Fl_Return_Button* o = new Fl_Return_Button(132, 90, 143, 25, "Run Command");
      o->callback((Fl_Callback*)do_shell_command);
    } // Fl_Return_Button* o
    { Fl_Button* o = new Fl_Button(285, 90, 72, 25, "Cancel");
      o->callback((Fl_Callback*)cb_Cancel);
    } // Fl_Button* o
    shell_window->end();
  } // Fl_Double_Window* shell_window
  { shell_run_window = new Fl_Double_Window(555, 430, "Shell Command Output");
    { shell_run_display = new Fl_Text_Display(10, 10, 535, 375);
      shell_run_display->box(FL_DOWN_BOX);
      shell_run_display->textfont(4);
      Fl_Group::current()->resizable(shell_run_display);
      shell_run_buffer = new Fl_Text_Buffer();
      shell_run_display->buffer(shell_run_buffer);
    } // Fl_Text_Display* shell_run_display
    { shell_run_button = new Fl_Return_Button(468, 395, 77, 25, "Close");
      shell_run_button->callback((Fl_Callback*)cb_shell_run_button);
    } // Fl_Return_Button* shell_run_button
    shell_run_window->end();
  } // Fl_Double_Window* shell_run_window
  return shell_run_window;
}